

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O1

SampledSpectrum __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f
          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> *this,Vector3f wo,
          Vector3f wi,TransportMode mode)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  bool bVar27;
  byte bVar28;
  int i;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  byte bVar33;
  uint uVar34;
  uint uVar35;
  uint64_t oldstate;
  ulong uVar36;
  TransportMode TVar37;
  long in_FS_OFFSET;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  Float FVar43;
  float fVar42;
  float extraout_XMM0_Dc;
  ulong in_XMM0_Qb;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float extraout_XMM0_Db;
  float extraout_XMM0_Dd;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar66 [56];
  undefined1 auVar61 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar70 [16];
  undefined1 auVar88 [56];
  undefined1 auVar84 [64];
  ulong in_XMM2_Qb;
  undefined1 auVar89 [16];
  uint in_XMM3_Db;
  uint in_XMM3_Dd;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined4 in_XMM6_Da;
  undefined1 in_register_00001384 [12];
  Vector3f wo_00;
  Vector3f wo_01;
  Vector3f VVar93;
  Vector3f wo_03;
  Vector3f wo_04;
  Vector3f wo_05;
  Vector3f wo_06;
  Vector3f wo_07;
  Vector3f wo_08;
  Vector3f wo_09;
  Vector3f wo_10;
  Vector3f wi_00;
  Vector3f wi_01;
  Vector3f wi_02;
  Vector3f wi_03;
  Vector3f wi_04;
  Vector3f wi_05;
  Vector3f wi_06;
  SampledSpectrum SVar94;
  Vector3f w;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> exitInterface;
  SampledSpectrum beta;
  Float g;
  optional<pbrt::PhaseFunctionSample> ps;
  optional<pbrt::BSDFSample> wis;
  Float f_1;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> nonExitInterface;
  Float pdf;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> enterInterface;
  optional<pbrt::BSDFSample> wos;
  Vector3f local_208;
  TransportMode TStack_1fc;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> local_1f8;
  undefined1 local_1e8 [4];
  float afStack_1e4 [6];
  ushort local_1ca;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [4];
  Vector3f VStack_1b4;
  Vector3f local_1a8 [2];
  bool local_18c;
  undefined1 local_188 [4];
  float afStack_184 [3];
  Vector3f local_178 [2];
  bool local_15c;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [16];
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> local_138;
  float local_11c;
  float local_118;
  float local_114;
  uint local_110;
  float local_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  uint uStack_f4;
  undefined4 uStack_f0;
  uint uStack_ec;
  ulong local_e8;
  ulong uStack_e0;
  undefined1 local_d8 [4];
  float afStack_d4 [4];
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float local_b4;
  TransportMode local_b0;
  uint local_ac;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF> local_a8;
  ulong local_98;
  ulong uStack_90;
  undefined1 local_88 [16];
  undefined1 local_78 [4];
  float afStack_74 [10];
  bool local_4c;
  undefined1 local_48 [16];
  Vector3f wo_02;
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar83 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  
  local_f8 = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  local_e8 = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar61._4_60_ = wo._12_60_;
  auVar61._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  local_98 = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  uStack_f0 = 0;
  local_48 = auVar61._0_16_;
  uStack_f4 = in_XMM3_Db;
  uStack_ec = in_XMM3_Dd;
  uStack_e0 = in_XMM2_Qb;
  uStack_90 = in_XMM0_Qb;
  if (((this->config).twoSided != '\0') && (auVar61._0_4_ < 0.0)) {
    local_98 = local_98 ^ 0x8000000080000000;
    uStack_90 = in_XMM0_Qb ^ 0x8000000080000000;
    local_48._0_8_ = CONCAT44(wo._12_4_,auVar61._0_4_) ^ 0x8000000080000000;
    local_48._8_4_ = wo._16_4_ ^ 0x80000000;
    local_48._12_4_ = wo._20_4_ ^ 0x80000000;
    local_e8 = local_e8 ^ 0x8000000080000000;
    uStack_e0 = in_XMM2_Qb ^ 0x8000000080000000;
    local_f8 = -local_f8;
    uStack_f4 = in_XMM3_Db ^ 0x80000000;
    uStack_ec = in_XMM3_Dd ^ 0x80000000;
    uStack_f0 = 0x80000000;
  }
  fVar41 = local_48._0_4_;
  if (fVar41 <= 0.0) {
    local_a8.bottom = &this->bottom;
    local_a8.top = (DielectricInterfaceBxDF *)0x0;
  }
  else {
    local_a8.bottom = (ConductorBxDF *)0x0;
    local_a8.top = &this->top;
  }
  fVar42 = fVar41 * local_f8;
  if (0.0 < fVar41 == 0.0 < fVar42) {
    local_1f8.bottom = (ConductorBxDF *)0x0;
    local_1f8.top = &this->top;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = &this->bottom;
    local_138 = (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>)
                (auVar39 << 0x40);
  }
  else {
    auVar38._8_8_ = 0;
    auVar38._0_8_ = &this->bottom;
    local_1f8 = (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>)
                (auVar38 << 0x40);
    local_138.bottom = (ConductorBxDF *)0x0;
    local_138.top = &this->top;
  }
  local_88 = ZEXT416((uint)this->thickness);
  local_108 = 0.0;
  fStack_104 = 0.0;
  fStack_100 = 0.0;
  fStack_fc = 0.0;
  if (0.0 < fVar42) {
    bVar33 = (this->config).nSamples;
    VVar93.super_Tuple3<pbrt::Vector3,_float>.z = fVar41;
    VVar93.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_98;
    VVar93.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_98._4_4_;
    auVar88 = ZEXT856(local_48._8_8_);
    auVar66 = ZEXT856(uStack_90);
    wi_00.super_Tuple3<pbrt::Vector3,_float>.z = local_f8;
    wi_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_e8;
    wi_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_e8._4_4_;
    SVar94 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::f
                       (&local_a8,VVar93,wi_00,mode);
    auVar83._0_8_ = SVar94.values.values._8_8_;
    auVar83._8_56_ = auVar88;
    auVar84._0_8_ = SVar94.values.values._0_8_;
    auVar84._8_56_ = auVar66;
    auVar39 = vmovlhps_avx(auVar84._0_16_,auVar83._0_16_);
    fStack_fc = (float)bVar33;
    local_108 = auVar39._0_4_ * fStack_fc;
    fStack_104 = auVar39._4_4_ * fStack_fc;
    fStack_100 = auVar39._8_4_ * fStack_fc;
    fStack_fc = auVar39._12_4_ * fStack_fc;
  }
  bVar33 = (this->config).nSamples;
  if (bVar33 != 0) {
    local_88._0_4_ = (uint)(0.0 < fVar41 == 0.0 < fVar42) * local_88._0_4_;
    uVar36 = local_98 * -0x395b586ca42e166b;
    uVar36 = (CONCAT44((int)(uVar36 >> 0x20),local_48._0_4_) ^
             ((uVar36 >> 0x2f ^ uVar36) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
             -0x395b586ca42e166b) * -0x395b586ca42e166b;
    uVar36 = (uVar36 >> 0x2f ^ uVar36) * -0x395b586ca42e166b;
    uVar36 = (*Options & 0xffffff ^ uVar36 ^ 0x1a929e4d6f47a654 ^
             (uVar36 >> 0x2f | (ulong)(*Options & 0xff000000))) * -0x395b586ca42e166b;
    uVar36 = (uVar36 >> 0x2f ^ uVar36) * -0x395b586ca42e166b;
    lVar1 = (uVar36 >> 0x2f ^ uVar36) * 2 + 1;
    uVar36 = (CONCAT44(0x4fb7dae8,local_f8) ^
             ((local_e8 * -0x395b586ca42e166b >> 0x2f ^ local_e8 * -0x395b586ca42e166b) *
              -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) * -0x395b586ca42e166b) * -0x395b586ca42e166b
    ;
    uVar36 = (uVar36 >> 0x2f ^ uVar36) * -0x395b586ca42e166b;
    uVar36 = (uVar36 >> 0x2f ^ uVar36) * 0x5851f42d4c957f2d + lVar1 * 0x5851f42d4c957f2e;
    local_b0 = (TransportMode)(mode == Radiance);
    uVar35 = 0;
    uVar3 = vcmpss_avx512f((undefined1  [16])0x0,local_48,1);
    local_1ca = (ushort)uVar3 & 1;
    TStack_1fc = mode;
    do {
      uVar34 = (uint)(uVar36 >> 0x2d) ^ (uint)(uVar36 >> 0x1b);
      bVar33 = (byte)(uVar36 >> 0x3b);
      auVar19._4_12_ = in_register_00001384;
      auVar19._0_4_ = in_XMM6_Da;
      auVar39 = vcvtusi2ss_avx512f(auVar19,uVar34 >> bVar33 | uVar34 << 0x20 - bVar33);
      auVar39 = vminss_avx(ZEXT416((uint)(auVar39._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
      uVar30 = uVar36 * 0x5851f42d4c957f2d + lVar1;
      uVar31 = uVar30 * 0x5851f42d4c957f2d + lVar1;
      uVar36 = uVar31 * 0x5851f42d4c957f2d + lVar1;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uVar30;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = uVar31;
      auVar45 = vpunpcklqdq_avx(auVar44,auVar67);
      auVar38 = vpsrlvq_avx2(auVar45,_DAT_0045e970);
      auVar2 = vpsrlvq_avx2(auVar45,_DAT_0045e980);
      auVar38 = vpshufd_avx(auVar38 ^ auVar2,0xe8);
      auVar45 = vpsrlq_avx(auVar45,0x3b);
      auVar45 = vpshufd_avx(auVar45,0xe8);
      auVar38 = vprorvd_avx512vl(auVar38,auVar45);
      auVar38 = vcvtudq2ps_avx512vl(auVar38);
      auVar45._8_4_ = 0x2f800000;
      auVar45._0_8_ = 0x2f8000002f800000;
      auVar45._12_4_ = 0x2f800000;
      auVar38 = vmulps_avx512vl(auVar38,auVar45);
      auVar2._8_4_ = 0x3f7fffff;
      auVar2._0_8_ = 0x3f7fffff3f7fffff;
      auVar2._12_4_ = 0x3f7fffff;
      auVar38 = vminps_avx512vl(auVar38,auVar2);
      wo_00.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_48._0_4_;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_98;
      wo_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_98._4_4_;
      TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Sample_f
                ((optional<pbrt::BSDFSample> *)local_78,&local_a8,wo_00,auVar39._0_4_,
                 (Point2f)auVar38._0_8_,mode,Transmission);
      if (local_4c == true) {
        if (((float)local_78 == 0.0) && (!NAN((float)local_78))) {
          uVar30 = 0;
          while (uVar31 = uVar30, uVar31 != 3) {
            if ((afStack_74[uVar31] != 0.0) || (uVar30 = uVar31 + 1, NAN(afStack_74[uVar31])))
            break;
          }
          if (2 < uVar31) goto LAB_00420c2e;
        }
        if (((afStack_74[6] != 0.0) || (NAN(afStack_74[6]))) &&
           ((afStack_74[5] != 0.0 || (NAN(afStack_74[5]))))) {
          auVar68._4_4_ = afStack_74[5];
          auVar68._0_4_ = afStack_74[5];
          auVar68._8_4_ = afStack_74[5];
          auVar68._12_4_ = afStack_74[5];
          auVar4._8_4_ = 0x7fffffff;
          auVar4._0_8_ = 0x7fffffff7fffffff;
          auVar4._12_4_ = 0x7fffffff;
          auVar39 = vandps_avx512vl(auVar68,auVar4);
          auVar69._0_4_ = auVar39._0_4_ * (float)local_78;
          auVar69._4_4_ = auVar39._4_4_ * afStack_74[0];
          auVar69._8_4_ = auVar39._8_4_ * afStack_74[1];
          auVar69._12_4_ = auVar39._12_4_ * afStack_74[2];
          auVar46._4_4_ = afStack_74[6];
          auVar46._0_4_ = afStack_74[6];
          auVar46._8_4_ = afStack_74[6];
          auVar46._12_4_ = afStack_74[6];
          _local_1e8 = vdivps_avx(auVar69,auVar46);
          local_208.super_Tuple3<pbrt::Vector3,_float>.z = afStack_74[5];
          local_208.super_Tuple3<pbrt::Vector3,_float>.x = afStack_74[3];
          local_208.super_Tuple3<pbrt::Vector3,_float>.y = afStack_74[4];
          local_1c8 = ZEXT416((uint)((byte)local_1ca & 1) * (int)this->thickness);
          local_10c = this->g;
          uVar34 = (uint)(uVar36 >> 0x2d) ^ (uint)(uVar36 >> 0x1b);
          bVar33 = (byte)(uVar36 >> 0x3b);
          auVar20._4_12_ = in_register_00001384;
          auVar20._0_4_ = in_XMM6_Da;
          auVar39 = vcvtusi2ss_avx512f(auVar20,uVar34 >> bVar33 | uVar34 << 0x20 - bVar33);
          auVar39 = vminss_avx(ZEXT416((uint)(auVar39._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
          uVar36 = uVar36 * 0x5851f42d4c957f2d + lVar1;
          uVar30 = uVar36 * 0x5851f42d4c957f2d + lVar1;
          auVar47._8_8_ = 0;
          auVar47._0_8_ = uVar36;
          auVar70._8_8_ = 0;
          auVar70._0_8_ = uVar30;
          auVar45 = vpunpcklqdq_avx(auVar47,auVar70);
          auVar38 = vpsrlvq_avx2(auVar45,_DAT_0045e970);
          auVar2 = vpsrlvq_avx2(auVar45,_DAT_0045e980);
          auVar38 = vpshufd_avx(auVar38 ^ auVar2,0xe8);
          auVar45 = vpsrlq_avx(auVar45,0x3b);
          auVar45 = vpshufd_avx(auVar45,0xe8);
          auVar38 = vprorvd_avx512vl(auVar38,auVar45);
          auVar38 = vcvtudq2ps_avx512vl(auVar38);
          auVar5._8_4_ = 0x2f800000;
          auVar5._0_8_ = 0x2f8000002f800000;
          auVar5._12_4_ = 0x2f800000;
          auVar38 = vmulps_avx512vl(auVar38,auVar5);
          auVar6._8_4_ = 0x3f7fffff;
          auVar6._0_8_ = 0x3f7fffff3f7fffff;
          auVar6._12_4_ = 0x3f7fffff;
          auVar38 = vminps_avx512vl(auVar38,auVar6);
          wo_01.super_Tuple3<pbrt::Vector3,_float>.z = local_f8;
          wo_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_e8;
          wo_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_e8._4_4_;
          TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Sample_f
                    ((optional<pbrt::BSDFSample> *)local_188,&local_1f8,wo_01,auVar39._0_4_,
                     (Point2f)auVar38._0_8_,local_b0,Transmission);
          uVar36 = uVar30 * 0x5851f42d4c957f2d + lVar1;
          if (local_15c == true) {
            if (((float)local_188 == 0.0) && (!NAN((float)local_188))) {
              uVar30 = 0;
              while (uVar31 = uVar30, uVar31 != 3) {
                if ((afStack_184[uVar31] != 0.0) || (uVar30 = uVar31 + 1, NAN(afStack_184[uVar31])))
                break;
              }
              if (2 < uVar31) goto LAB_00420c17;
            }
            if ((((local_178[1].super_Tuple3<pbrt::Vector3,_float>.x != 0.0) ||
                 (NAN(local_178[1].super_Tuple3<pbrt::Vector3,_float>.x))) &&
                ((local_178[0].super_Tuple3<pbrt::Vector3,_float>.z != 0.0 ||
                 (NAN(local_178[0].super_Tuple3<pbrt::Vector3,_float>.z))))) &&
               ((this->config).maxDepth != '\0')) {
              auVar39 = vfmadd213ss_fma(ZEXT416((uint)local_10c),ZEXT416((uint)local_10c),
                                        SUB6416(ZEXT464(0x3f800000),0));
              local_110 = auVar39._0_4_;
              local_114 = local_10c + local_10c;
              auVar39 = vfnmadd213ss_fma(ZEXT416((uint)local_10c),ZEXT416((uint)local_10c),
                                         SUB6416(ZEXT464(0x3f800000),0));
              local_118 = auVar39._0_4_ * 0.07957747;
              uVar34 = 0;
              auVar61 = ZEXT1664(local_1c8);
              uVar30 = uVar36;
              do {
                TVar37 = TStack_1fc;
                local_1c8 = auVar61._0_16_;
                local_ac = uVar34;
                if (3 < uVar34) {
                  lVar32 = 1;
                  auVar61 = ZEXT464((uint)local_1e8);
                  auVar84 = ZEXT464((uint)local_1e8);
                  do {
                    auVar39 = vmaxss_avx(ZEXT416(*(uint *)(local_1e8 + lVar32 * 4)),auVar84._0_16_);
                    auVar84 = ZEXT1664(auVar39);
                    lVar32 = lVar32 + 1;
                  } while (lVar32 != 4);
                  if (auVar39._0_4_ < 0.25) {
                    lVar32 = 1;
                    do {
                      auVar39 = vmaxss_avx(ZEXT416(*(uint *)(local_1e8 + lVar32 * 4)),auVar61._0_16_
                                          );
                      auVar61 = ZEXT1664(auVar39);
                      lVar32 = lVar32 + 1;
                    } while (lVar32 != 4);
                    auVar39 = vmaxss_avx(ZEXT416((uint)(1.0 - auVar39._0_4_)),ZEXT416(0));
                    uVar36 = uVar30 * 0x5851f42d4c957f2d + lVar1;
                    uVar34 = (uint)(uVar30 >> 0x2d) ^ (uint)(uVar30 >> 0x1b);
                    bVar33 = (byte)(uVar30 >> 0x3b);
                    auVar21._4_12_ = in_register_00001384;
                    auVar21._0_4_ = in_XMM6_Da;
                    auVar38 = vcvtusi2ss_avx512f(auVar21,uVar34 >> bVar33 | uVar34 << 0x20 - bVar33)
                    ;
                    auVar38 = vminss_avx(ZEXT416((uint)(auVar38._0_4_ * 2.3283064e-10)),
                                         ZEXT416(0x3f7fffff));
                    if (auVar38._0_4_ < auVar39._0_4_) break;
                    fVar41 = 1.0 - auVar39._0_4_;
                    auVar48._4_4_ = fVar41;
                    auVar48._0_4_ = fVar41;
                    auVar48._8_4_ = fVar41;
                    auVar48._12_4_ = fVar41;
                    _local_1e8 = vdivps_avx(_local_1e8,auVar48);
                    uVar30 = uVar36;
                  }
                }
                fVar41 = (this->albedo).values.values[0];
                if ((fVar41 != 0.0) || (NAN(fVar41))) {
LAB_00420dd8:
                  uVar34 = (uint)(uVar30 >> 0x2d) ^ (uint)(uVar30 >> 0x1b);
                  bVar33 = (byte)(uVar30 >> 0x3b);
                  auVar22._4_12_ = in_register_00001384;
                  auVar22._0_4_ = in_XMM6_Da;
                  auVar39 = vcvtusi2ss_avx512f(auVar22,uVar34 >> bVar33 | uVar34 << 0x20 - bVar33);
                  auVar39 = vminss_avx(ZEXT416((uint)(auVar39._0_4_ * 2.3283064e-10)),
                                       ZEXT416(0x3f7fffff));
                  local_148 = ZEXT416((uint)local_208.super_Tuple3<pbrt::Vector3,_float>.z);
                  afStack_d4[3] = logf(1.0 - auVar39._0_4_);
                  auVar49._0_12_ = ZEXT412(0);
                  auVar49._12_4_ = 0;
                  uVar3 = vcmpss_avx512f(auVar49,ZEXT416((uint)local_208.
                                                               super_Tuple3<pbrt::Vector3,_float>.z)
                                         ,1);
                  local_158._0_2_ = (ushort)uVar3 & 1;
                  fStack_c4 = extraout_XMM0_Db;
                  fStack_c0 = extraout_XMM0_Dc;
                  fStack_bc = extraout_XMM0_Dd;
                  if ((LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>::
                       f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg == '\0'
                      ) && (iVar29 = __cxa_guard_acquire(&
                                                  LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>
                                                  ::
                                                  f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)
                                                  ::reg), iVar29 != 0)) {
                    StatRegisterer::StatRegisterer
                              ((StatRegisterer *)
                               &LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>::
                                f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::
                                reg,const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,
                               (PixelAccumFunc)0x0);
                    __cxa_guard_release(&LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>
                                         ::
                                         f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)
                                         ::reg);
                    TVar37 = TStack_1fc;
                  }
                  uVar36 = uVar30 * 0x5851f42d4c957f2d + lVar1;
                  auVar7._8_4_ = 0x7fffffff;
                  auVar7._0_8_ = 0x7fffffff7fffffff;
                  auVar7._12_4_ = 0x7fffffff;
                  auVar39 = vandps_avx512vl(local_148,auVar7);
                  fVar41 = -afStack_d4[3] / (1.0 / auVar39._0_4_);
                  fVar42 = local_1c8._0_4_;
                  fVar41 = fVar42 + (float)((uint)(local_158[0] & 1) * (int)fVar41 +
                                           (uint)!(bool)(local_158[0] & 1) * (int)-fVar41);
                  *(long *)(in_FS_OFFSET + -0x100) = *(long *)(in_FS_OFFSET + -0x100) + 1;
                  if ((fVar42 != fVar41) || (NAN(fVar42) || NAN(fVar41))) {
                    auVar39 = ZEXT416((uint)fVar41);
                    if ((0.0 < fVar41) && (fVar41 < this->thickness)) {
                      if (local_1f8.top == (DielectricInterfaceBxDF *)0x0) {
                        auVar38 = vminss_avx(ZEXT416((uint)((local_1f8.bottom)->mfDistrib).alpha_y),
                                             ZEXT416((uint)((local_1f8.bottom)->mfDistrib).alpha_x))
                        ;
                        bVar33 = (auVar38._0_4_ < 0.001) * '\b' + 9;
                      }
                      else {
                        auVar38 = vminss_avx(ZEXT416((uint)((local_1f8.top)->mfDistrib).alpha_y),
                                             ZEXT416((uint)((local_1f8.top)->mfDistrib).alpha_x));
                        bVar33 = (auVar38._0_4_ < 0.001) * '\b' + 0xb;
                      }
                      auVar38 = SUB6416(ZEXT464(0x3f800000),0);
                      local_148 = auVar39;
                      if (bVar33 < 0x10) {
                        if (local_15c == false) {
                          LogFatal<char_const(&)[4]>
                                    (Fatal,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                     ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
                        }
                        auVar39 = vfmadd231ss_fma(ZEXT416((uint)(local_208.
                                                                 super_Tuple3<pbrt::Vector3,_float>.
                                                                 y * local_178[0].
                                                                                                                                          
                                                  super_Tuple3<pbrt::Vector3,_float>.y)),
                                                  ZEXT416((uint)local_208.
                                                                super_Tuple3<pbrt::Vector3,_float>.x
                                                         ),ZEXT416((uint)local_178[0].
                                                                                                                                                  
                                                  super_Tuple3<pbrt::Vector3,_float>.x));
                        auVar39 = vfmadd231ss_fma(auVar39,ZEXT416((uint)local_208.
                                                                                                                                                
                                                  super_Tuple3<pbrt::Vector3,_float>.z),
                                                  ZEXT416((uint)local_178[0].
                                                                super_Tuple3<pbrt::Vector3,_float>.z
                                                         ));
                        auVar38 = vfmadd213ss_fma(auVar39,ZEXT416((uint)local_114),
                                                  ZEXT416(local_110));
                        auVar72._0_12_ = ZEXT812(0);
                        auVar72._12_4_ = 0;
                        auVar39 = vmaxss_avx(auVar38,auVar72);
                        if (auVar39._0_4_ < 0.0) {
                          local_158._0_4_ = local_178[1].super_Tuple3<pbrt::Vector3,_float>.x;
                          afStack_d4[3] = auVar38._0_4_;
                          fVar42 = sqrtf(auVar39._0_4_);
                          fVar41 = afStack_d4[3];
                        }
                        else {
                          auVar39 = vsqrtss_avx(auVar39,auVar39);
                          fVar42 = auVar39._0_4_;
                          local_158._0_4_ = local_178[1].super_Tuple3<pbrt::Vector3,_float>.x;
                          fVar41 = auVar38._0_4_;
                        }
                        fVar41 = local_118 / (fVar42 * fVar41);
                        auVar38 = ZEXT416((uint)(((float)local_158._0_4_ * (float)local_158._0_4_) /
                                                ((float)local_158._0_4_ * (float)local_158._0_4_ +
                                                fVar41 * fVar41)));
                      }
                      _local_158 = auVar38;
                      if (local_15c == false) {
LAB_00421cd4:
                        LogFatal<char_const(&)[4]>
                                  (Fatal,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                   ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
                      }
                      afStack_d4[3] = (this->albedo).values.values[0] * (float)local_1e8;
                      fStack_c4 = (this->albedo).values.values[1] * afStack_1e4[0];
                      fStack_c0 = (this->albedo).values.values[2] * afStack_1e4[1];
                      fStack_bc = (this->albedo).values.values[3] * afStack_1e4[2];
                      auVar39 = vfmadd231ss_fma(ZEXT416((uint)(local_208.
                                                               super_Tuple3<pbrt::Vector3,_float>.y
                                                              * local_178[0].
                                                                super_Tuple3<pbrt::Vector3,_float>.y
                                                              )),
                                                ZEXT416((uint)local_208.
                                                              super_Tuple3<pbrt::Vector3,_float>.x),
                                                ZEXT416((uint)local_178[0].
                                                              super_Tuple3<pbrt::Vector3,_float>.x))
                      ;
                      auVar39 = vfmadd231ss_fma(auVar39,ZEXT416((uint)local_208.
                                                                                                                                            
                                                  super_Tuple3<pbrt::Vector3,_float>.z),
                                                ZEXT416((uint)local_178[0].
                                                              super_Tuple3<pbrt::Vector3,_float>.z))
                      ;
                      auVar39 = vfmadd213ss_fma(auVar39,ZEXT416((uint)local_114),ZEXT416(local_110))
                      ;
                      auVar73._0_12_ = ZEXT812(0);
                      auVar73._12_4_ = 0;
                      local_b4 = auVar39._0_4_;
                      auVar39 = vmaxss_avx(auVar39,auVar73);
                      if (auVar39._0_4_ < 0.0) {
                        local_11c = sqrtf(auVar39._0_4_);
                      }
                      else {
                        auVar39 = vsqrtss_avx(auVar39,auVar39);
                        local_11c = auVar39._0_4_;
                      }
                      if (local_15c != true) goto LAB_00421cd4;
                      local_b8 = (float)local_148._0_4_ - (float)local_88._0_4_;
                      FVar43 = Tr(local_b8,local_178);
                      if (local_15c != true) goto LAB_00421cd4;
                      fVar41 = local_118 / (local_11c * local_b4);
                      auVar50._0_4_ =
                           FVar43 * (float)local_158._0_4_ * fVar41 * afStack_d4[3] *
                           (float)local_188;
                      auVar50._4_4_ =
                           FVar43 * (float)local_158._0_4_ * fVar41 * fStack_c4 * afStack_184[0];
                      auVar50._8_4_ =
                           FVar43 * (float)local_158._0_4_ * fVar41 * fStack_c0 * afStack_184[1];
                      auVar50._12_4_ =
                           FVar43 * (float)local_158._0_4_ * fVar41 * fStack_bc * afStack_184[2];
                      auVar16._4_4_ = local_178[1].super_Tuple3<pbrt::Vector3,_float>.x;
                      auVar16._0_4_ = local_178[1].super_Tuple3<pbrt::Vector3,_float>.x;
                      auVar16._8_4_ = local_178[1].super_Tuple3<pbrt::Vector3,_float>.x;
                      auVar16._12_4_ = local_178[1].super_Tuple3<pbrt::Vector3,_float>.x;
                      _local_158 = vdivps_avx512vl(auVar50,auVar16);
                      auVar51._0_8_ =
                           local_208.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                      auVar51._8_4_ = 0x80000000;
                      auVar51._12_4_ = 0x80000000;
                      wo_02.super_Tuple3<pbrt::Vector3,_float>.z =
                           -local_208.super_Tuple3<pbrt::Vector3,_float>.z;
                      uVar30 = uVar36 * 0x5851f42d4c957f2d + lVar1;
                      auVar89._8_8_ = 0;
                      auVar89._0_8_ = uVar36;
                      auVar90._8_8_ = 0;
                      auVar90._0_8_ = uVar30;
                      auVar38 = vpunpcklqdq_avx(auVar89,auVar90);
                      auVar39 = vpsrlvq_avx2(auVar38,_DAT_0045e970);
                      auVar45 = vpsrlvq_avx2(auVar38,_DAT_0045e980);
                      auVar39 = vpshufd_avx(auVar39 ^ auVar45,0xe8);
                      auVar38 = vpsrlq_avx(auVar38,0x3b);
                      auVar38 = vpshufd_avx(auVar38,0xe8);
                      auVar39 = vprorvd_avx512vl(auVar39,auVar38);
                      auVar39 = vcvtudq2ps_avx512vl(auVar39);
                      auVar17._8_4_ = 0x2f800000;
                      auVar17._0_8_ = 0x2f8000002f800000;
                      auVar17._12_4_ = 0x2f800000;
                      auVar39 = vmulps_avx512vl(auVar39,auVar17);
                      auVar18._8_4_ = 0x3f7fffff;
                      auVar18._0_8_ = 0x3f7fffff3f7fffff;
                      auVar18._12_4_ = 0x3f7fffff;
                      auVar39 = vminps_avx512vl(auVar39,auVar18);
                      wo_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar51._0_8_;
                      wo_02.super_Tuple3<pbrt::Vector3,_float>.y =
                           (float)(int)(auVar51._0_8_ >> 0x20);
                      auVar66 = ZEXT856(auVar51._8_8_);
                      VVar93 = SampleHenyeyGreenstein
                                         (wo_02,local_10c,(Point2f)auVar39._0_8_,(Float *)local_d8);
                      VStack_1b4.super_Tuple3<pbrt::Vector3,_float>.z =
                           VVar93.super_Tuple3<pbrt::Vector3,_float>.z;
                      auVar62._0_8_ = VVar93.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                      auVar62._8_56_ = auVar66;
                      local_108 = local_108 + (float)local_158._0_4_;
                      fStack_104 = fStack_104 + (float)local_158._4_4_;
                      fStack_100 = fStack_100 + fStack_150;
                      fStack_fc = fStack_fc + fStack_14c;
                      local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.y =
                           (float)CONCAT31(local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.y._1_3_,1
                                          );
                      local_1b8 = local_d8;
                      uVar36 = vmovlps_avx(auVar62._0_16_);
                      VStack_1b4.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar36;
                      VStack_1b4.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(uVar36 >> 0x20)
                      ;
                      local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.x = (float)local_d8;
                      auVar40 = local_1c8;
                      if ((((float)local_d8 != 0.0) || (NAN((float)local_d8))) &&
                         ((VStack_1b4.super_Tuple3<pbrt::Vector3,_float>.z != 0.0 ||
                          (NAN(VStack_1b4.super_Tuple3<pbrt::Vector3,_float>.z))))) {
                        auVar52._4_4_ = local_d8;
                        auVar52._0_4_ = local_d8;
                        auVar52._8_4_ = local_d8;
                        auVar52._12_4_ = local_d8;
                        auVar74._0_4_ = (float)local_d8 * (this->albedo).values.values[0];
                        auVar74._4_4_ = (float)local_d8 * (this->albedo).values.values[1];
                        auVar74._8_4_ = (float)local_d8 * (this->albedo).values.values[2];
                        auVar74._12_4_ = (float)local_d8 * (this->albedo).values.values[3];
                        auVar39 = vdivps_avx(auVar74,auVar52);
                        afStack_1e4[0] = auVar39._4_4_ * afStack_1e4[0];
                        local_1e8 = (undefined1  [4])(auVar39._0_4_ * (float)local_1e8);
                        afStack_1e4[1] = auVar39._8_4_ * afStack_1e4[1];
                        afStack_1e4[2] = auVar39._12_4_ * afStack_1e4[2];
                        if (local_1f8.top == (DielectricInterfaceBxDF *)0x0) {
                          auVar39 = vminss_avx(ZEXT416((uint)((local_1f8.bottom)->mfDistrib).alpha_y
                                                      ),ZEXT416((uint)((local_1f8.bottom)->mfDistrib
                                                                      ).alpha_x));
                          bVar33 = (auVar39._0_4_ < 0.001) * '\b' + 9;
                        }
                        else {
                          auVar39 = vminss_avx(ZEXT416((uint)((local_1f8.top)->mfDistrib).alpha_y),
                                               ZEXT416((uint)((local_1f8.top)->mfDistrib).alpha_x));
                          bVar33 = (auVar39._0_4_ < 0.001) * '\b' + 0xb;
                        }
                        auVar40 = local_148;
                        local_208.super_Tuple3<pbrt::Vector3,_float>._0_8_ = uVar36;
                        local_208.super_Tuple3<pbrt::Vector3,_float>.z =
                             VStack_1b4.super_Tuple3<pbrt::Vector3,_float>.z;
                        if (bVar33 < 0x10) {
                          auVar75._0_4_ = -VStack_1b4.super_Tuple3<pbrt::Vector3,_float>.z;
                          auVar75._4_4_ = 0x80000000;
                          auVar75._8_4_ = 0x80000000;
                          auVar75._12_4_ = 0x80000000;
                          auVar53._0_8_ = uVar36 ^ 0x8000000080000000;
                          auVar53._8_4_ = 0x80000000;
                          auVar53._12_4_ = 0x80000000;
                          wo_03.super_Tuple3<pbrt::Vector3,_float>.z = auVar75._0_4_;
                          wo_03.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar53._0_8_;
                          wo_03.super_Tuple3<pbrt::Vector3,_float>.y =
                               (float)(int)(auVar53._0_8_ >> 0x20);
                          auVar88 = ZEXT856(auVar75._8_8_);
                          auVar66 = ZEXT856(auVar53._8_8_);
                          wi_01.super_Tuple3<pbrt::Vector3,_float>.z = local_f8;
                          wi_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_e8;
                          wi_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_e8._4_4_;
                          SVar94 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                   ::f(&local_1f8,wo_03,wi_01,TVar37);
                          auVar85._0_8_ = SVar94.values.values._8_8_;
                          auVar85._8_56_ = auVar88;
                          auVar63._0_8_ = SVar94.values.values._0_8_;
                          auVar63._8_56_ = auVar66;
                          _local_d8 = vmovlhps_avx(auVar63._0_16_,auVar85._0_16_);
                          if (((float)local_d8 == 0.0) && (!NAN((float)local_d8))) {
                            uVar36 = 0;
                            while (uVar31 = uVar36, uVar31 != 3) {
                              if ((*(float *)(local_d8 + uVar31 * 4 + 4) != 0.0) ||
                                 (uVar36 = uVar31 + 1, NAN(*(float *)(local_d8 + uVar31 * 4 + 4))))
                              break;
                            }
                            auVar40 = local_148;
                            if (2 < uVar31) goto LAB_0042148c;
                          }
                          wo_04.super_Tuple3<pbrt::Vector3,_float>.z =
                               -local_208.super_Tuple3<pbrt::Vector3,_float>.z;
                          wo_04.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                               local_208.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^
                               0x8000000080000000;
                          wi_02.super_Tuple3<pbrt::Vector3,_float>.z = local_f8;
                          wi_02.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_e8;
                          wi_02.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_e8._4_4_;
                          FVar43 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                   ::PDF(&local_1f8,wo_04,wi_02,TVar37,Transmission);
                          local_1c8._0_4_ = FVar43;
                          if (local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.y._0_1_ == '\0') {
                            LogFatal<char_const(&)[4]>
                                      (Fatal,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                       ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
                          }
                          local_158._0_4_ = local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.x;
                          FVar43 = Tr(local_b8,&VStack_1b4);
                          fVar41 = ((float)local_158._0_4_ * (float)local_158._0_4_) /
                                   ((float)local_1c8._0_4_ * (float)local_1c8._0_4_ +
                                   (float)local_158._0_4_ * (float)local_158._0_4_);
                          local_108 = fVar41 * FVar43 * (float)local_1e8 * (float)local_d8 +
                                      local_108;
                          fStack_104 = fVar41 * FVar43 * afStack_1e4[0] * afStack_d4[0] + fStack_104
                          ;
                          fStack_100 = fVar41 * FVar43 * afStack_1e4[1] * afStack_d4[1] + fStack_100
                          ;
                          fStack_fc = fVar41 * FVar43 * afStack_1e4[2] * afStack_d4[2] + fStack_fc;
                          auVar40 = local_148;
                        }
                      }
LAB_0042148c:
                      if (local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.y._0_1_ == '\x01') {
                        local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.y =
                             (float)((uint)local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.y &
                                    0xffffff00);
                      }
                      uVar36 = uVar30 * 0x5851f42d4c957f2d + lVar1;
                      goto LAB_0042149f;
                    }
                    auVar71._0_12_ = ZEXT812(0);
                    auVar71._12_4_ = 0;
                    uVar3 = vcmpss_avx512f(auVar39,auVar71,1);
                    auVar39 = vminss_avx(ZEXT416((uint)this->thickness),auVar39);
                    auVar40._4_12_ = auVar39._4_12_;
                    auVar40._0_4_ = (uint)!(bool)((byte)uVar3 & 1) * auVar39._0_4_;
                    bVar27 = true;
                  }
                  else {
                    *(long *)(in_FS_OFFSET + -0x108) = *(long *)(in_FS_OFFSET + -0x108) + 1;
                    auVar40 = local_1c8;
LAB_0042149f:
                    bVar27 = false;
                  }
                  auVar61 = ZEXT1664(auVar40);
                  uVar30 = uVar36;
                  if (bVar27) goto LAB_004214a9;
                }
                else {
                  uVar36 = 0;
                  while (uVar31 = uVar36, uVar31 != 3) {
                    fVar41 = (this->albedo).values.values[uVar31 + 1];
                    if ((fVar41 != 0.0) || (uVar36 = uVar31 + 1, NAN(fVar41))) break;
                  }
                  if (uVar31 < 3) goto LAB_00420dd8;
                  local_148 = ZEXT416((uint)this->thickness);
                  FVar43 = Tr(this->thickness,&local_208);
                  uVar3 = vcmpss_avx512f(local_148,ZEXT416((uint)local_1c8._0_4_),0);
                  auVar40._4_12_ = local_148._4_12_;
                  auVar40._0_4_ = (uint)!(bool)((byte)uVar3 & 1) * local_148._0_4_;
                  afStack_1e4[0] = FVar43 * afStack_1e4[0];
                  local_1e8 = (undefined1  [4])(FVar43 * (float)local_1e8);
                  afStack_1e4[1] = FVar43 * afStack_1e4[1];
                  afStack_1e4[2] = FVar43 * afStack_1e4[2];
LAB_004214a9:
                  bVar33 = (byte)(uVar30 >> 0x38);
                  uVar34 = (uint)(uVar30 >> 0x20);
                  local_148 = auVar40;
                  if ((auVar40._0_4_ != (float)local_88._0_4_) ||
                     (NAN(auVar40._0_4_) || NAN((float)local_88._0_4_))) {
                    if (local_138.top == (DielectricInterfaceBxDF *)0x0) {
                      auVar39 = vminss_avx(ZEXT416((uint)((local_138.bottom)->mfDistrib).alpha_y),
                                           ZEXT416((uint)((local_138.bottom)->mfDistrib).alpha_x));
                      bVar28 = (auVar39._0_4_ < 0.001) * '\b' + 9;
                    }
                    else {
                      auVar39 = vminss_avx(ZEXT416((uint)((local_138.top)->mfDistrib).alpha_y),
                                           ZEXT416((uint)((local_138.top)->mfDistrib).alpha_x));
                      bVar28 = (auVar39._0_4_ < 0.001) * '\b' + 0xb;
                    }
                    if (bVar28 < 0x10) {
                      if (local_1f8.top == (DielectricInterfaceBxDF *)0x0) {
                        auVar39 = vminss_avx(ZEXT416((uint)((local_1f8.bottom)->mfDistrib).alpha_y),
                                             ZEXT416((uint)((local_1f8.bottom)->mfDistrib).alpha_x))
                        ;
                        bVar28 = (auVar39._0_4_ < 0.001) * '\b' + 9;
                      }
                      else {
                        auVar39 = vminss_avx(ZEXT416((uint)((local_1f8.top)->mfDistrib).alpha_y),
                                             ZEXT416((uint)((local_1f8.top)->mfDistrib).alpha_x));
                        bVar28 = (auVar39._0_4_ < 0.001) * '\b' + 0xb;
                      }
                      auVar39 = SUB6416(ZEXT464(0x3f800000),0);
                      if (bVar28 < 0x10) {
                        if (local_15c == false) {
                          LogFatal<char_const(&)[4]>
                                    (Fatal,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                     ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
                        }
                        local_1c8._0_4_ = local_178[1].super_Tuple3<pbrt::Vector3,_float>.x;
                        wo_06.super_Tuple3<pbrt::Vector3,_float>.z =
                             -local_208.super_Tuple3<pbrt::Vector3,_float>.z;
                        wi_03.super_Tuple3<pbrt::Vector3,_float>.z =
                             -local_178[0].super_Tuple3<pbrt::Vector3,_float>.z;
                        wo_06.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                             local_208.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000
                        ;
                        wi_03.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                             CONCAT44(local_178[0].super_Tuple3<pbrt::Vector3,_float>.y,
                                      local_178[0].super_Tuple3<pbrt::Vector3,_float>.x) ^
                             0x8000000080000000;
                        FVar43 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                 ::PDF(&local_138,wo_06,wi_03,TVar37,All);
                        auVar39 = ZEXT416((uint)(((float)local_1c8._0_4_ * (float)local_1c8._0_4_) /
                                                ((float)local_1c8._0_4_ * (float)local_1c8._0_4_ +
                                                FVar43 * FVar43)));
                      }
                      local_1c8 = auVar39;
                      if (local_15c == false) {
LAB_00421cf8:
                        LogFatal<char_const(&)[4]>
                                  (Fatal,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                   ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
                      }
                      auVar78._0_4_ = -local_208.super_Tuple3<pbrt::Vector3,_float>.z;
                      auVar78._4_4_ = 0x80000000;
                      auVar78._8_4_ = 0x80000000;
                      auVar78._12_4_ = 0x80000000;
                      wi_04.super_Tuple3<pbrt::Vector3,_float>.z =
                           -local_178[0].super_Tuple3<pbrt::Vector3,_float>.z;
                      auVar55._0_8_ =
                           local_208.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                      auVar55._8_4_ = 0x80000000;
                      auVar55._12_4_ = 0x80000000;
                      wi_04.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                           CONCAT44(local_178[0].super_Tuple3<pbrt::Vector3,_float>.y,
                                    local_178[0].super_Tuple3<pbrt::Vector3,_float>.x) ^
                           0x8000000080000000;
                      wo_07.super_Tuple3<pbrt::Vector3,_float>.z = auVar78._0_4_;
                      wo_07.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar55._0_8_;
                      wo_07.super_Tuple3<pbrt::Vector3,_float>.y =
                           (float)(int)(auVar55._0_8_ >> 0x20);
                      auVar88 = ZEXT856(auVar78._8_8_);
                      auVar66 = ZEXT856(auVar55._8_8_);
                      SVar94 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::
                               f(&local_138,wo_07,wi_04,TVar37);
                      auVar86._0_8_ = SVar94.values.values._8_8_;
                      auVar86._8_56_ = auVar88;
                      auVar64._0_8_ = SVar94.values.values._0_8_;
                      auVar64._8_56_ = auVar66;
                      if (local_15c != true) goto LAB_00421cf8;
                      auVar39 = vmovlhps_avx(auVar64._0_16_,auVar86._0_16_);
                      local_158._4_4_ = auVar39._4_4_ * afStack_1e4[0];
                      local_158._0_4_ = auVar39._0_4_ * (float)local_1e8;
                      fStack_150 = auVar39._8_4_ * afStack_1e4[1];
                      fStack_14c = auVar39._12_4_ * afStack_1e4[2];
                      afStack_d4[3] = local_178[0].super_Tuple3<pbrt::Vector3,_float>.z;
                      fStack_c4 = local_178[0].super_Tuple3<pbrt::Vector3,_float>.z;
                      fStack_c0 = local_178[0].super_Tuple3<pbrt::Vector3,_float>.z;
                      fStack_bc = local_178[0].super_Tuple3<pbrt::Vector3,_float>.z;
                      FVar43 = Tr(this->thickness,local_178);
                      if (local_15c != true) goto LAB_00421cf8;
                      auVar26._4_4_ = fStack_c4;
                      auVar26._0_4_ = afStack_d4[3];
                      auVar26._8_4_ = fStack_c0;
                      auVar26._12_4_ = fStack_bc;
                      auVar11._8_4_ = 0x7fffffff;
                      auVar11._0_8_ = 0x7fffffff7fffffff;
                      auVar11._12_4_ = 0x7fffffff;
                      auVar39 = vandps_avx512vl(auVar26,auVar11);
                      auVar56._0_4_ =
                           FVar43 * (float)local_1c8._0_4_ * auVar39._0_4_ * (float)local_158._0_4_
                           * (float)local_188;
                      auVar56._4_4_ =
                           FVar43 * (float)local_1c8._0_4_ * auVar39._4_4_ * (float)local_158._4_4_
                           * afStack_184[0];
                      auVar56._8_4_ =
                           FVar43 * (float)local_1c8._0_4_ * auVar39._8_4_ * fStack_150 *
                           afStack_184[1];
                      auVar56._12_4_ =
                           FVar43 * (float)local_1c8._0_4_ * auVar39._12_4_ * fStack_14c *
                           afStack_184[2];
                      auVar12._4_4_ = local_178[1].super_Tuple3<pbrt::Vector3,_float>.x;
                      auVar12._0_4_ = local_178[1].super_Tuple3<pbrt::Vector3,_float>.x;
                      auVar12._8_4_ = local_178[1].super_Tuple3<pbrt::Vector3,_float>.x;
                      auVar12._12_4_ = local_178[1].super_Tuple3<pbrt::Vector3,_float>.x;
                      auVar39 = vdivps_avx512vl(auVar56,auVar12);
                      local_108 = auVar39._0_4_ + local_108;
                      fStack_104 = auVar39._4_4_ + fStack_104;
                      fStack_100 = auVar39._8_4_ + fStack_100;
                      fStack_fc = auVar39._12_4_ + fStack_fc;
                    }
                    uVar34 = uVar34 >> 0xd ^ (uint)(uVar30 >> 0x1b);
                    bVar33 = bVar33 >> 3;
                    auVar24._4_12_ = in_register_00001384;
                    auVar24._0_4_ = in_XMM6_Da;
                    auVar39 = vcvtusi2ss_avx512f(auVar24,uVar34 >> bVar33 | uVar34 << 0x20 - bVar33)
                    ;
                    auVar39 = vminss_avx(ZEXT416((uint)(auVar39._0_4_ * 2.3283064e-10)),
                                         ZEXT416(0x3f7fffff));
                    uVar36 = uVar30 * 0x5851f42d4c957f2d + lVar1;
                    uVar30 = uVar36 * 0x5851f42d4c957f2d + lVar1;
                    auVar57._8_8_ = 0;
                    auVar57._0_8_ = uVar36;
                    auVar79._8_8_ = 0;
                    auVar79._0_8_ = uVar30;
                    auVar45 = vpunpcklqdq_avx(auVar57,auVar79);
                    auVar38 = vpsrlvq_avx2(auVar45,_DAT_0045e970);
                    auVar2 = vpsrlvq_avx2(auVar45,_DAT_0045e980);
                    auVar38 = vpshufd_avx(auVar38 ^ auVar2,0xe8);
                    auVar45 = vpsrlq_avx(auVar45,0x3b);
                    auVar45 = vpshufd_avx(auVar45,0xe8);
                    auVar38 = vprorvd_avx512vl(auVar38,auVar45);
                    auVar38 = vcvtudq2ps_avx512vl(auVar38);
                    auVar13._8_4_ = 0x2f800000;
                    auVar13._0_8_ = 0x2f8000002f800000;
                    auVar13._12_4_ = 0x2f800000;
                    auVar38 = vmulps_avx512vl(auVar38,auVar13);
                    auVar14._8_4_ = 0x3f7fffff;
                    auVar14._0_8_ = 0x3f7fffff3f7fffff;
                    auVar14._12_4_ = 0x3f7fffff;
                    auVar38 = vminps_avx512vl(auVar38,auVar14);
                    wo_08.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                         local_208.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                    wo_08.super_Tuple3<pbrt::Vector3,_float>.z =
                         -local_208.super_Tuple3<pbrt::Vector3,_float>.z;
                    TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Sample_f
                              ((optional<pbrt::BSDFSample> *)local_1b8,&local_138,wo_08,
                               auVar39._0_4_,(Point2f)auVar38._0_8_,TStack_1fc,Reflection);
                    TVar37 = TStack_1fc;
                    uVar36 = uVar30 * 0x5851f42d4c957f2d + lVar1;
                    if (local_18c != true) break;
                    if (((float)local_1b8 == 0.0) && (!NAN((float)local_1b8))) {
                      uVar30 = 0;
                      while (uVar31 = uVar30, uVar31 != 3) {
                        fVar41 = (&VStack_1b4.super_Tuple3<pbrt::Vector3,_float>.x)[uVar31];
                        if ((fVar41 != 0.0) || (uVar30 = uVar31 + 1, NAN(fVar41))) break;
                      }
                      if (2 < uVar31) goto LAB_00421c92;
                    }
                    if (((local_1a8[1].super_Tuple3<pbrt::Vector3,_float>.x == 0.0) &&
                        (!NAN(local_1a8[1].super_Tuple3<pbrt::Vector3,_float>.x))) ||
                       ((local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.z == 0.0 &&
                        (!NAN(local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.z)))))
                    goto LAB_00421c92;
                    auVar80._4_4_ = local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar80._0_4_ = local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar80._8_4_ = local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar80._12_4_ = local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar15._8_4_ = 0x7fffffff;
                    auVar15._0_8_ = 0x7fffffff7fffffff;
                    auVar15._12_4_ = 0x7fffffff;
                    auVar39 = vandps_avx512vl(auVar80,auVar15);
                    auVar81._0_4_ = auVar39._0_4_ * (float)local_1b8;
                    auVar81._4_4_ = auVar39._4_4_ * VStack_1b4.super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar81._8_4_ = auVar39._8_4_ * VStack_1b4.super_Tuple3<pbrt::Vector3,_float>.y;
                    auVar81._12_4_ =
                         auVar39._12_4_ * VStack_1b4.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar58._4_4_ = local_1a8[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar58._0_4_ = local_1a8[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar58._8_4_ = local_1a8[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar58._12_4_ = local_1a8[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar39 = vdivps_avx(auVar81,auVar58);
                    afStack_1e4[0] = auVar39._4_4_ * afStack_1e4[0];
                    local_1e8 = (undefined1  [4])(auVar39._0_4_ * (float)local_1e8);
                    afStack_1e4[1] = auVar39._8_4_ * afStack_1e4[1];
                    afStack_1e4[2] = auVar39._12_4_ * afStack_1e4[2];
                    local_208.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                         CONCAT44(local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.y,
                                  local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.x);
                    local_208.super_Tuple3<pbrt::Vector3,_float>.z =
                         local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    if (local_1f8.top == (DielectricInterfaceBxDF *)0x0) {
                      auVar39 = vminss_avx(ZEXT416((uint)((local_1f8.bottom)->mfDistrib).alpha_y),
                                           ZEXT416((uint)((local_1f8.bottom)->mfDistrib).alpha_x));
                      bVar33 = (auVar39._0_4_ < 0.001) * '\b' + 9;
                    }
                    else {
                      auVar39 = vminss_avx(ZEXT416((uint)((local_1f8.top)->mfDistrib).alpha_y),
                                           ZEXT416((uint)((local_1f8.top)->mfDistrib).alpha_x));
                      bVar33 = (auVar39._0_4_ < 0.001) * '\b' + 0xb;
                    }
                    if (bVar33 < 0x10) {
                      auVar82._0_4_ = -local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.z;
                      auVar82._4_4_ = 0x80000000;
                      auVar82._8_4_ = 0x80000000;
                      auVar82._12_4_ = 0x80000000;
                      auVar59._0_8_ =
                           local_208.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                      auVar59._8_4_ = 0x80000000;
                      auVar59._12_4_ = 0x80000000;
                      wo_09.super_Tuple3<pbrt::Vector3,_float>.z = auVar82._0_4_;
                      wo_09.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)auVar59._0_8_;
                      wo_09.super_Tuple3<pbrt::Vector3,_float>.y =
                           (float)(int)(auVar59._0_8_ >> 0x20);
                      auVar88 = ZEXT856(auVar82._8_8_);
                      auVar66 = ZEXT856(auVar59._8_8_);
                      wi_05.super_Tuple3<pbrt::Vector3,_float>.z = local_f8;
                      wi_05.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_e8;
                      wi_05.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_e8._4_4_;
                      SVar94 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::
                               f(&local_1f8,wo_09,wi_05,TStack_1fc);
                      auVar87._0_8_ = SVar94.values.values._8_8_;
                      auVar87._8_56_ = auVar88;
                      auVar65._0_8_ = SVar94.values.values._0_8_;
                      auVar65._8_56_ = auVar66;
                      _local_d8 = vmovlhps_avx(auVar65._0_16_,auVar87._0_16_);
                      if (((float)local_d8 == 0.0) && (!NAN((float)local_d8))) {
                        uVar30 = 0;
                        while (uVar31 = uVar30, uVar31 != 3) {
                          if ((*(float *)(local_d8 + uVar31 * 4 + 4) != 0.0) ||
                             (uVar30 = uVar31 + 1, NAN(*(float *)(local_d8 + uVar31 * 4 + 4))))
                          break;
                        }
                        if (2 < uVar31) goto LAB_00421c1e;
                      }
                      if (local_138.top == (DielectricInterfaceBxDF *)0x0) {
                        auVar39 = vminss_avx(ZEXT416((uint)((local_138.bottom)->mfDistrib).alpha_y),
                                             ZEXT416((uint)((local_138.bottom)->mfDistrib).alpha_x))
                        ;
                        bVar33 = (auVar39._0_4_ < 0.001) * '\b' + 9;
                      }
                      else {
                        auVar39 = vminss_avx(ZEXT416((uint)((local_138.top)->mfDistrib).alpha_y),
                                             ZEXT416((uint)((local_138.top)->mfDistrib).alpha_x));
                        bVar33 = (auVar39._0_4_ < 0.001) * '\b' + 0xb;
                      }
                      auVar39 = SUB6416(ZEXT464(0x3f800000),0);
                      if (bVar33 < 0x10) {
                        wo_10.super_Tuple3<pbrt::Vector3,_float>.z =
                             -local_208.super_Tuple3<pbrt::Vector3,_float>.z;
                        wo_10.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                             local_208.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000
                        ;
                        wi_06.super_Tuple3<pbrt::Vector3,_float>.z = local_f8;
                        wi_06.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)local_e8;
                        wi_06.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_e8._4_4_;
                        FVar43 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>
                                 ::PDF(&local_1f8,wo_10,wi_06,TVar37,Transmission);
                        if (local_18c == false) {
                          LogFatal<char_const(&)[4]>
                                    (Fatal,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                     ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
                        }
                        auVar39 = ZEXT416((uint)((local_1a8[1].super_Tuple3<pbrt::Vector3,_float>.x
                                                 * local_1a8[1].super_Tuple3<pbrt::Vector3,_float>.x
                                                 ) / (FVar43 * FVar43 +
                                                     local_1a8[1].super_Tuple3<pbrt::Vector3,_float>
                                                     .x * local_1a8[1].
                                                          super_Tuple3<pbrt::Vector3,_float>.x)));
                      }
                      local_1c8 = auVar39;
                      if (local_18c == false) {
                        LogFatal<char_const(&)[4]>
                                  (Fatal,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                                   ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
                      }
                      FVar43 = Tr(this->thickness,local_1a8);
                      local_108 = (float)local_1c8._0_4_ *
                                  FVar43 * (float)local_1e8 * (float)local_d8 + local_108;
                      fStack_104 = (float)local_1c8._0_4_ * FVar43 * afStack_1e4[0] * afStack_d4[0]
                                   + fStack_104;
                      fStack_100 = (float)local_1c8._0_4_ * FVar43 * afStack_1e4[1] * afStack_d4[1]
                                   + fStack_100;
                      fStack_fc = (float)local_1c8._0_4_ * FVar43 * afStack_1e4[2] * afStack_d4[2] +
                                  fStack_fc;
                    }
LAB_00421c1e:
                    auVar61 = ZEXT1664(local_148);
                    if (local_18c == true) {
                      local_18c = false;
                    }
                  }
                  else {
                    uVar34 = uVar34 >> 0xd ^ (uint)(uVar30 >> 0x1b);
                    bVar33 = bVar33 >> 3;
                    auVar23._4_12_ = in_register_00001384;
                    auVar23._0_4_ = in_XMM6_Da;
                    auVar39 = vcvtusi2ss_avx512f(auVar23,uVar34 >> bVar33 | uVar34 << 0x20 - bVar33)
                    ;
                    auVar39 = vminss_avx(ZEXT416((uint)(auVar39._0_4_ * 2.3283064e-10)),
                                         ZEXT416(0x3f7fffff));
                    wo_05.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                         local_208.super_Tuple3<pbrt::Vector3,_float>._0_8_ ^ 0x8000000080000000;
                    wo_05.super_Tuple3<pbrt::Vector3,_float>.z =
                         -local_208.super_Tuple3<pbrt::Vector3,_float>.z;
                    uVar36 = uVar30 * 0x5851f42d4c957f2d + lVar1;
                    uVar30 = uVar36 * 0x5851f42d4c957f2d + lVar1;
                    auVar91._8_8_ = 0;
                    auVar91._0_8_ = uVar36;
                    auVar92._8_8_ = 0;
                    auVar92._0_8_ = uVar30;
                    auVar45 = vpunpcklqdq_avx(auVar91,auVar92);
                    auVar38 = vpsrlvq_avx2(auVar45,_DAT_0045e970);
                    auVar2 = vpsrlvq_avx2(auVar45,_DAT_0045e980);
                    auVar38 = vpshufd_avx(auVar38 ^ auVar2,0xe8);
                    auVar45 = vpsrlq_avx(auVar45,0x3b);
                    auVar45 = vpshufd_avx(auVar45,0xe8);
                    auVar38 = vprorvd_avx512vl(auVar38,auVar45);
                    auVar38 = vcvtudq2ps_avx512vl(auVar38);
                    auVar8._8_4_ = 0x2f800000;
                    auVar8._0_8_ = 0x2f8000002f800000;
                    auVar8._12_4_ = 0x2f800000;
                    auVar38 = vmulps_avx512vl(auVar38,auVar8);
                    auVar9._8_4_ = 0x3f7fffff;
                    auVar9._0_8_ = 0x3f7fffff3f7fffff;
                    auVar9._12_4_ = 0x3f7fffff;
                    auVar38 = vminps_avx512vl(auVar38,auVar9);
                    TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::ConductorBxDF>::Sample_f
                              ((optional<pbrt::BSDFSample> *)local_1b8,&local_1f8,wo_05,
                               auVar39._0_4_,(Point2f)auVar38._0_8_,TVar37,Reflection);
                    uVar36 = uVar30 * 0x5851f42d4c957f2d + lVar1;
                    if (local_18c != true) break;
                    if (((float)local_1b8 == 0.0) && (!NAN((float)local_1b8))) {
                      uVar30 = 0;
                      while (uVar31 = uVar30, uVar31 != 3) {
                        fVar41 = (&VStack_1b4.super_Tuple3<pbrt::Vector3,_float>.x)[uVar31];
                        if ((fVar41 != 0.0) || (uVar30 = uVar31 + 1, NAN(fVar41))) break;
                      }
                      if (2 < uVar31) goto LAB_00421c92;
                    }
                    if (((local_1a8[1].super_Tuple3<pbrt::Vector3,_float>.x == 0.0) &&
                        (!NAN(local_1a8[1].super_Tuple3<pbrt::Vector3,_float>.x))) ||
                       ((local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.z == 0.0 &&
                        (!NAN(local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.z))))) {
LAB_00421c92:
                      if (local_18c != false) {
                        local_18c = false;
                      }
                      break;
                    }
                    auVar76._4_4_ = local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar76._0_4_ = local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar76._8_4_ = local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar76._12_4_ = local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar10._8_4_ = 0x7fffffff;
                    auVar10._0_8_ = 0x7fffffff7fffffff;
                    auVar10._12_4_ = 0x7fffffff;
                    auVar39 = vandps_avx512vl(auVar76,auVar10);
                    auVar77._0_4_ = auVar39._0_4_ * (float)local_1b8;
                    auVar77._4_4_ = auVar39._4_4_ * VStack_1b4.super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar77._8_4_ = auVar39._8_4_ * VStack_1b4.super_Tuple3<pbrt::Vector3,_float>.y;
                    auVar77._12_4_ =
                         auVar39._12_4_ * VStack_1b4.super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar54._4_4_ = local_1a8[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar54._0_4_ = local_1a8[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar54._8_4_ = local_1a8[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar54._12_4_ = local_1a8[1].super_Tuple3<pbrt::Vector3,_float>.x;
                    auVar39 = vdivps_avx(auVar77,auVar54);
                    afStack_1e4[0] = auVar39._4_4_ * afStack_1e4[0];
                    local_1e8 = (undefined1  [4])(auVar39._0_4_ * (float)local_1e8);
                    afStack_1e4[1] = auVar39._8_4_ * afStack_1e4[1];
                    afStack_1e4[2] = auVar39._12_4_ * afStack_1e4[2];
                    local_208.super_Tuple3<pbrt::Vector3,_float>._0_8_ =
                         CONCAT44(local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.y,
                                  local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.x);
                    local_208.super_Tuple3<pbrt::Vector3,_float>.z =
                         local_1a8[0].super_Tuple3<pbrt::Vector3,_float>.z;
                    auVar61 = ZEXT1664(local_148);
                  }
                }
                uVar34 = local_ac + 1;
                uVar30 = uVar36;
              } while (uVar34 < (this->config).maxDepth);
            }
          }
LAB_00420c17:
          mode = TStack_1fc;
          if (local_15c == true) {
            local_15c = false;
          }
        }
      }
LAB_00420c2e:
      if (local_4c == true) {
        local_4c = false;
      }
      uVar35 = uVar35 + 1;
      bVar33 = (this->config).nSamples;
    } while (uVar35 < bVar33);
  }
  auVar60._0_4_ = (float)bVar33;
  auVar60._4_4_ = auVar60._0_4_;
  auVar60._8_4_ = auVar60._0_4_;
  auVar60._12_4_ = auVar60._0_4_;
  auVar25._4_4_ = fStack_104;
  auVar25._0_4_ = local_108;
  auVar25._8_4_ = fStack_100;
  auVar25._12_4_ = fStack_fc;
  auVar39 = vdivps_avx(auVar25,auVar60);
  auVar38 = vshufpd_avx(auVar39,auVar39,1);
  SVar94.values.values._0_8_ = auVar39._0_8_;
  SVar94.values.values._8_8_ = auVar38._0_8_;
  return (SampledSpectrum)SVar94.values.values;
}

Assistant:

f(Vector3f wo, Vector3f wi, TransportMode mode) const {
        SampledSpectrum f(0.);
        // Estimate _LayeredBxDF_ value _f_ using random sampling
        // Set _wi_ and _wi_ for layered BSDF evaluation
        if (config.twoSided && wo.z < 0) {
            wo = -wo;
            wi = -wi;
        }

        // Determine entrance interface for layered BSDF
        TopOrBottomBxDF<TopBxDF, BottomBxDF> enterInterface;
        bool enteredTop = wo.z > 0;
        if (enteredTop)
            enterInterface = &top;
        else
            enterInterface = &bottom;

        // Determine exit interface and exit $z$ for layered BSDF
        TopOrBottomBxDF<TopBxDF, BottomBxDF> exitInterface, nonExitInterface;
        if (SameHemisphere(wo, wi) ^ enteredTop) {
            exitInterface = &bottom;
            nonExitInterface = &top;
        } else {
            exitInterface = &top;
            nonExitInterface = &bottom;
        }
        Float exitZ = (SameHemisphere(wo, wi) ^ enteredTop) ? 0 : thickness;

        // Account for reflection at the entrance interface
        if (SameHemisphere(wo, wi))
            f = config.nSamples * enterInterface.f(wo, wi, mode);

        // Declare _RNG_ for layered BSDF evaluation
        RNG rng(Hash(GetOptions().seed, wo), Hash(wi));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        for (int s = 0; s < config.nSamples; ++s) {
            // Sample random walk through layers to estimate BSDF value
            // Sample transmission direction through entrance interface
            Float uc = r();
            pstd::optional<BSDFSample> wos = enterInterface.Sample_f(
                wo, uc, Point2f(r(), r()), mode, BxDFReflTransFlags::Transmission);
            if (!wos || !wos->f || wos->pdf == 0 || wos->wi.z == 0)
                continue;

            // Declare state for random walk through BSDF layers
            SampledSpectrum beta = wos->f * AbsCosTheta(wos->wi) / wos->pdf;
            Vector3f w = wos->wi;
            Float z = enteredTop ? thickness : 0;
            HGPhaseFunction phase(g);

            // Sample BSDF for NEE in _wi_'s direction
            uc = r();
            pstd::optional<BSDFSample> wis = exitInterface.Sample_f(
                wi, uc, Point2f(r(), r()), !mode, BxDFReflTransFlags::Transmission);
            if (!wis || !wis->f || wis->pdf == 0 || wis->wi.z == 0)
                continue;

            for (int depth = 0; depth < config.maxDepth; ++depth) {
                // Sample next event for layered BSDF evaluation random walk
                PBRT_DBG("beta: %f %f %f %f, w: %f %f %f, f: %f %f %f %f\n", beta[0],
                         beta[1], beta[2], beta[3], w.x, w.y, w.z, f[0], f[1], f[2],
                         f[3]);
                // Possibly terminate layered BSDF random walk with Russian Roulette
                if (depth > 3 && beta.MaxComponentValue() < 0.25f) {
                    Float q = std::max<Float>(0, 1 - beta.MaxComponentValue());
                    if (r() < q)
                        break;
                    beta /= 1 - q;
                    PBRT_DBG("After RR with q = %f, beta: %f %f %f %f\n", q, beta[0],
                             beta[1], beta[2], beta[3]);
                }

                // Account for media between layers and possibly scatter
                if (!albedo) {
                    // Advance to next layer boundary and update _beta_ for transmittance
                    z = (z == thickness) ? 0 : thickness;
                    beta *= Tr(thickness, w);

                } else {
                    // Sample medium scattering for layered BSDF evaluation
                    Float sigma_t = 1;
                    Float dz = SampleExponential(r(), sigma_t / std::abs(w.z));
                    Float zp = w.z > 0 ? (z + dz) : (z - dz);
                    CHECK_RARE(1e-5, z == zp);
                    if (z == zp)
                        continue;
                    if (0 < zp && zp < thickness) {
                        // Handle scattering event in layered BSDF medium
                        // Account for scattering through _exitInterface_ using _wis_
                        Float wt = 1;
                        if (!IsSpecular(exitInterface.Flags()))
                            wt = PowerHeuristic(1, wis->pdf, 1, phase.PDF(-w, -wis->wi));
                        f += beta * albedo * phase.p(-w, -wis->wi) * wt *
                             Tr(zp - exitZ, wis->wi) * wis->f / wis->pdf;

                        // Sample phase function and update layered path state
                        pstd::optional<PhaseFunctionSample> ps =
                            phase.Sample_p(-w, Point2f(r(), r()));
                        if (!ps || ps->pdf == 0 || ps->wi.z == 0)
                            continue;
                        beta *= albedo * ps->p / ps->pdf;
                        w = ps->wi;
                        z = zp;

                        if (!IsSpecular(exitInterface.Flags())) {
                            // Account for scattering through _exitInterface_ from new _w_
                            SampledSpectrum fExit = exitInterface.f(-w, wi, mode);
                            if (fExit) {
                                Float exitPDF = exitInterface.PDF(
                                    -w, wi, mode, BxDFReflTransFlags::Transmission);
                                Float weight = PowerHeuristic(1, ps->pdf, 1, exitPDF);
                                f += beta * Tr(zp - exitZ, ps->wi) * fExit * weight;
                            }
                        }

                        continue;
                    }
                    z = Clamp(zp, 0, thickness);
                }

                // Account for scattering at appropriate interface
                if (z == exitZ) {
                    // Account for reflection at _exitInterface_
                    Float uc = r();
                    pstd::optional<BSDFSample> bs = exitInterface.Sample_f(
                        -w, uc, Point2f(r(), r()), mode, BxDFReflTransFlags::Reflection);
                    if (!bs || !bs->f || bs->pdf == 0 || bs->wi.z == 0)
                        break;
                    beta *= bs->f * AbsCosTheta(bs->wi) / bs->pdf;
                    w = bs->wi;

                } else {
                    // Account for scattering at _nonExitInterface_
                    if (!IsSpecular(nonExitInterface.Flags())) {
                        // Add NEE contribution along pre-sampled _wis_ direction
                        Float wt = 1;
                        if (!IsSpecular(exitInterface.Flags()))
                            wt = PowerHeuristic(1, wis->pdf, 1,
                                                nonExitInterface.PDF(-w, -wis->wi, mode));
                        f += beta * nonExitInterface.f(-w, -wis->wi, mode) *
                             AbsCosTheta(wis->wi) * wt * Tr(thickness, wis->wi) * wis->f /
                             wis->pdf;
                    }
                    // Sample new direction using BSDF at _nonExitInterface_
                    Float uc = r();
                    Point2f u(r(), r());
                    pstd::optional<BSDFSample> bs = nonExitInterface.Sample_f(
                        -w, uc, u, mode, BxDFReflTransFlags::Reflection);
                    if (!bs || !bs->f || bs->pdf == 0 || bs->wi.z == 0)
                        break;
                    beta *= bs->f * AbsCosTheta(bs->wi) / bs->pdf;
                    w = bs->wi;

                    if (!IsSpecular(exitInterface.Flags())) {
                        // Add NEE contribution along direction from BSDF sample
                        SampledSpectrum fExit = exitInterface.f(-w, wi, mode);
                        if (fExit) {
                            Float wt = 1;
                            if (!IsSpecular(nonExitInterface.Flags())) {
                                Float exitPDF = exitInterface.PDF(
                                    -w, wi, mode, BxDFReflTransFlags::Transmission);
                                wt = PowerHeuristic(1, bs->pdf, 1, exitPDF);
                            }
                            f += beta * Tr(thickness, bs->wi) * fExit * wt;
                        }
                    }
                }
            }
        }

        return f / config.nSamples;
    }